

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lottieitem.cpp
# Opt level: O0

bool __thiscall
rlottie::internal::renderer::Composition::update
          (Composition *this,int frameNo,VSize *size,bool keepAspectRatio)

{
  undefined8 uVar1;
  bool bVar2;
  int iVar3;
  element_type *this_00;
  MatrixType in_CL;
  undefined8 *in_RDX;
  float in_ESI;
  VMatrix *in_RDI;
  float sy_00;
  float sx_00;
  float ty;
  float tx;
  float scale;
  float sy;
  float sx;
  VSize viewBox;
  VSize viewPort;
  VMatrix m;
  undefined4 in_stack_ffffffffffffff90;
  undefined4 in_stack_ffffffffffffff94;
  float local_64;
  float local_60;
  VSize local_5c;
  VSize local_54;
  VMatrix local_4c;
  MatrixType local_21;
  undefined8 *local_20;
  float local_14;
  bool local_1;
  
  local_21 = in_CL & Translate;
  local_20 = in_RDX;
  local_14 = in_ESI;
  if (((((in_RDI[3].dirty & Translate) == None) &&
       (bVar2 = VSize::operator==((VSize *)CONCAT44(in_stack_ffffffffffffff94,
                                                    in_stack_ffffffffffffff90),(VSize *)in_RDI),
       bVar2)) && (in_RDI[3].m33 == local_14)) &&
     ((in_RDI[3].mType & Translate) == (local_21 & Translate))) {
    local_1 = false;
  }
  else {
    uVar1 = *local_20;
    in_RDI[1].m33 = (float)(int)uVar1;
    in_RDI[1].mType = (char)((ulong)uVar1 >> 0x20);
    in_RDI[1].dirty = (char)((ulong)uVar1 >> 0x28);
    *(short *)&in_RDI[1].field_0x26 = (short)((ulong)uVar1 >> 0x30);
    in_RDI[3].m33 = local_14;
    in_RDI[3].mType = local_21 & Translate;
    VMatrix::VMatrix(&local_4c);
    local_54 = *(VSize *)&in_RDI[1].m33;
    this_00 = std::
              __shared_ptr_access<rlottie::internal::model::Composition,_(__gnu_cxx::_Lock_policy)2,_false,_false>
              ::operator->((__shared_ptr_access<rlottie::internal::model::Composition,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                            *)0x15e13e);
    local_5c = internal::model::Composition::size(this_00);
    iVar3 = VSize::width(&local_54);
    sy_00 = (float)iVar3;
    iVar3 = VSize::width(&local_5c);
    local_60 = sy_00 / (float)iVar3;
    iVar3 = VSize::height(&local_54);
    sx_00 = (float)iVar3;
    iVar3 = VSize::height(&local_5c);
    local_64 = sx_00 / (float)iVar3;
    if ((in_RDI[3].mType & Translate) == None) {
      VMatrix::scale(in_RDI,sx_00,sy_00);
    }
    else {
      std::min<float>(&local_60,&local_64);
      VSize::width(&local_54);
      VSize::width(&local_5c);
      VSize::height(&local_54);
      VSize::height(&local_5c);
      VMatrix::translate(in_RDI,sx_00,sy_00);
      VMatrix::scale(in_RDI,sx_00,sy_00);
    }
    (**(code **)(**(long **)&in_RDI[2].m22 + 0x10))(*(long **)&in_RDI[2].m22,local_14,&local_4c);
    local_1 = true;
  }
  return local_1;
}

Assistant:

bool renderer::Composition::update(int frameNo, const VSize &size,
                                   bool keepAspectRatio)
{
    // check if cached frame is same as requested frame.
    if (!mHasDynamicValue && (mViewSize == size) && (mCurFrameNo == frameNo) &&
        (mKeepAspectRatio == keepAspectRatio))
        return false;

    mViewSize = size;
    mCurFrameNo = frameNo;
    mKeepAspectRatio = keepAspectRatio;

    /*
     * if viewbox dosen't scale exactly to the viewport
     * we scale the viewbox keeping AspectRatioPreserved and then align the
     * viewbox to the viewport using AlignCenter rule.
     */
    VMatrix m;
    VSize   viewPort = mViewSize;
    VSize   viewBox = mModel->size();
    float   sx = float(viewPort.width()) / viewBox.width();
    float   sy = float(viewPort.height()) / viewBox.height();
    if (mKeepAspectRatio) {
        float scale = std::min(sx, sy);
        float tx = (viewPort.width() - viewBox.width() * scale) * 0.5f;
        float ty = (viewPort.height() - viewBox.height() * scale) * 0.5f;
        m.translate(tx, ty).scale(scale, scale);
    } else {
        m.scale(sx, sy);
    }
    mRootLayer->update(frameNo, m, 1.0);
    return true;
}